

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O0

void ApproximateCurve(Segment s,json *quadContour,double error)

{
  Segment s_00;
  Segment s_01;
  Segment s_02;
  Segment s_03;
  bool bVar1;
  size_type sVar2;
  reference pdVar3;
  double in_stack_fffffffffffffd78;
  undefined1 auStack_1b0 [8];
  pair<std::array<Point,_4UL>,_std::array<Point,_4UL>_> split;
  double i;
  iterator __end1;
  iterator __begin1;
  Solution *__range1;
  double prev;
  Segment curve;
  undefined1 local_70 [8];
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30 [8];
  Solution inflections;
  double error_local;
  json *quadContour_local;
  
  inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)error;
  memcpy(local_70,&s,0x40);
  s_03._M_elems[0].y = (double)local_60;
  s_03._M_elems[0].x = (double)uStack_68;
  s_03._M_elems[1].x = (double)uStack_58;
  s_03._M_elems[1].y = (double)local_50;
  s_03._M_elems[2].x = (double)uStack_48;
  s_03._M_elems[2].y = (double)local_40;
  s_03._M_elems[3].x = (double)uStack_38;
  s_03._M_elems[3].y = in_stack_fffffffffffffd78;
  SolveInflections(s_03);
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_30);
  if (sVar2 == 0) {
    ApproximateSimpleSegment
              (s,quadContour,
               (double)inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    curve._M_elems[3].y._0_4_ = 1;
  }
  else {
    memcpy(&prev,&s,0x40);
    __range1 = (Solution *)0x0;
    __end1 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_30);
    i = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)local_30);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)&i);
      if (!bVar1) break;
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end1);
      split.second._M_elems[3].y = *pdVar3;
      s_00._M_elems[0].y = curve._M_elems[0].x;
      s_00._M_elems[0].x = prev;
      s_00._M_elems[1].x = curve._M_elems[0].y;
      s_00._M_elems[1].y = curve._M_elems[1].x;
      s_00._M_elems[2].x = curve._M_elems[1].y;
      s_00._M_elems[2].y = curve._M_elems[2].x;
      s_00._M_elems[3].x = curve._M_elems[2].y;
      s_00._M_elems[3].y = curve._M_elems[3].x;
      SubdivideCubic((pair<std::array<Point,_4UL>,_std::array<Point,_4UL>_> *)auStack_1b0,
                     1.0 - (1.0 - split.second._M_elems[3].y) / (1.0 - (double)__range1),s_00);
      s_01._M_elems[0].y = split.first._M_elems[0].x;
      s_01._M_elems[0].x = (double)auStack_1b0;
      s_01._M_elems[1].x = split.first._M_elems[0].y;
      s_01._M_elems[1].y = split.first._M_elems[1].x;
      s_01._M_elems[2].x = split.first._M_elems[1].y;
      s_01._M_elems[2].y = split.first._M_elems[2].x;
      s_01._M_elems[3].x = split.first._M_elems[2].y;
      s_01._M_elems[3].y = split.first._M_elems[3].x;
      ApproximateSimpleSegment
                (s_01,quadContour,
                 (double)inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      memcpy(&prev,&split.first._M_elems[3].y,0x40);
      __range1 = (Solution *)split.second._M_elems[3].y;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end1);
    }
    s_02._M_elems[0].y = curve._M_elems[0].x;
    s_02._M_elems[0].x = prev;
    s_02._M_elems[1].x = curve._M_elems[0].y;
    s_02._M_elems[1].y = curve._M_elems[1].x;
    s_02._M_elems[2].x = curve._M_elems[1].y;
    s_02._M_elems[2].y = curve._M_elems[2].x;
    s_02._M_elems[3].x = curve._M_elems[2].y;
    s_02._M_elems[3].y = curve._M_elems[3].x;
    ApproximateSimpleSegment
              (s_02,quadContour,
               (double)inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    curve._M_elems[3].y._0_4_ = 0;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

static void ApproximateCurve(Segment s, json &quadContour, double error)
{
	Solution inflections = SolveInflections(s);
	if (!inflections.size())
		return ApproximateSimpleSegment(s, quadContour, error);
	Segment curve = s;
	double prev = 0;
	for (double i : inflections)
	{
		auto split = SubdivideCubic(1 - (1 - i) / (1 - prev), curve);
		ApproximateSimpleSegment(split.first, quadContour, error);
		curve = split.second;
		prev = i;
	}
	ApproximateSimpleSegment(curve, quadContour, error);
}